

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction_job.h
# Opt level: O2

void __thiscall
r_exec::ReductionJob<r_exec::GTPX>::ReductionJob
          (ReductionJob<r_exec::GTPX> *this,View *input,GTPX *processor)

{
  atomic_int_fast64_t *paVar1;
  
  _ReductionJob::_ReductionJob(&this->super__ReductionJob);
  (this->super__ReductionJob).super__Object._vptr__Object =
       (_func_int **)&PTR__ReductionJob_001d2db0;
  (this->input).object = (_Object *)input;
  if (input != (View *)0x0) {
    LOCK();
    paVar1 = &(input->super_View).super__Object.refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  (this->processor).object = (_Object *)processor;
  if (processor != (GTPX *)0x0) {
    LOCK();
    paVar1 = &(processor->super__TPX).super_TPX.super__Object.refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  return;
}

Assistant:

ReductionJob(View *input, _P *processor): _ReductionJob(), input(input), processor(processor) {}